

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O3

void __thiscall FIX::FieldMap::removeField(FieldMap *this,int tag)

{
  __normal_iterator<FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  __position;
  
  __position = lookup<__gnu_cxx::__normal_iterator<FIX::FieldBase*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>>
                         (this,(this->m_fields).
                               super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                          (this->m_fields).
                          super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
                          _M_impl.super__Vector_impl_data._M_finish,tag);
  if (__position._M_current !=
      (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::_M_erase
              (&this->m_fields,(iterator)__position._M_current);
    removeGroup(this,tag);
    return;
  }
  return;
}

Assistant:

void FieldMap::removeField(int tag) {
  Fields::iterator field = findTag(tag);
  if (field != m_fields.end()) {
    m_fields.erase(field);
    removeGroup(tag);
  }
}